

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

void __thiscall
soul::heart::Assignment::Assignment
          (Assignment *this,CodeLocation *l,pool_ptr<soul::heart::Expression> *dest)

{
  CodeLocation local_20;
  
  local_20.sourceCode.object = (l->sourceCode).object;
  (l->sourceCode).object = (SourceCodeText *)0x0;
  local_20.location.data = (l->location).data;
  Statement::Statement(&this->super_Statement,&local_20);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_20.sourceCode.object);
  (this->super_Statement).super_Object._vptr_Object = (_func_int **)&PTR__Assignment_00307258;
  (this->target).object = dest->object;
  return;
}

Assistant:

Assignment (CodeLocation l, pool_ptr<Expression> dest)  : Statement (std::move (l)), target (dest)  {}